

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

_Bool Curl_addr2string(sockaddr *sa,curl_socklen_t salen,char *addr,int *port)

{
  sa_family_t sVar1;
  _Bool _Var2;
  char *pcVar3;
  int *piVar4;
  int __af;
  
  sVar1 = sa->sa_family;
  if (sVar1 == 1) {
    if (salen < 3) {
      *addr = '\0';
    }
    else {
      curl_msnprintf(addr,0x2e,"%s",sa->sa_data);
    }
    *port = 0;
LAB_0011b278:
    _Var2 = true;
  }
  else {
    if (sVar1 == 10) {
      pcVar3 = sa->sa_data + 6;
      __af = 10;
LAB_0011b20f:
      pcVar3 = inet_ntop(__af,pcVar3,addr,0x2e);
      if (pcVar3 != (char *)0x0) {
        *port = (uint)(ushort)(*(ushort *)sa->sa_data << 8 | *(ushort *)sa->sa_data >> 8);
        goto LAB_0011b278;
      }
    }
    else if (sVar1 == 2) {
      pcVar3 = sa->sa_data + 2;
      __af = 2;
      goto LAB_0011b20f;
    }
    *addr = '\0';
    *port = 0;
    piVar4 = __errno_location();
    *piVar4 = 0x61;
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool Curl_addr2string(struct sockaddr *sa, curl_socklen_t salen,
                      char *addr, int *port)
{
  struct sockaddr_in *si = NULL;
#ifdef USE_IPV6
  struct sockaddr_in6 *si6 = NULL;
#endif
#if (defined(HAVE_SYS_UN_H) || defined(WIN32_SOCKADDR_UN)) && defined(AF_UNIX)
  struct sockaddr_un *su = NULL;
#else
  (void)salen;
#endif

  switch(sa->sa_family) {
    case AF_INET:
      si = (struct sockaddr_in *)(void *) sa;
      if(curlx_inet_ntop(sa->sa_family, &si->sin_addr,
                         addr, MAX_IPADR_LEN)) {
        unsigned short us_port = ntohs(si->sin_port);
        *port = us_port;
        return TRUE;
      }
      break;
#ifdef USE_IPV6
    case AF_INET6:
      si6 = (struct sockaddr_in6 *)(void *) sa;
      if(curlx_inet_ntop(sa->sa_family, &si6->sin6_addr,
                         addr, MAX_IPADR_LEN)) {
        unsigned short us_port = ntohs(si6->sin6_port);
        *port = us_port;
        return TRUE;
      }
      break;
#endif
#if (defined(HAVE_SYS_UN_H) || defined(WIN32_SOCKADDR_UN)) && defined(AF_UNIX)
    case AF_UNIX:
      if(salen > (curl_socklen_t)sizeof(CURL_SA_FAMILY_T)) {
        su = (struct sockaddr_un*)sa;
        msnprintf(addr, MAX_IPADR_LEN, "%s", su->sun_path);
      }
      else
        addr[0] = 0; /* socket with no name */
      *port = 0;
      return TRUE;
#endif
    default:
      break;
  }

  addr[0] = '\0';
  *port = 0;
  CURL_SETERRNO(SOCKEAFNOSUPPORT);
  return FALSE;
}